

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptxinfo.cpp
# Opt level: O2

void usage(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"Usage: ptxinfo [options] file\n");
  poVar1 = std::operator<<(poVar1,"  -v Show ptex software version\n");
  poVar1 = std::operator<<(poVar1,"  -m Dump meta data\n");
  poVar1 = std::operator<<(poVar1,"  -f Dump face info\n");
  poVar1 = std::operator<<(poVar1,"  -d Dump data\n");
  poVar1 = std::operator<<(poVar1,"  -D Dump data for all mipmap levels\n");
  poVar1 = std::operator<<(poVar1,"  -t Dump tiling info\n");
  poVar1 = std::operator<<(poVar1,"  -i Dump internal info\n");
  std::operator<<(poVar1,"  -c Check validity of adjacency data\n");
  exit(1);
}

Assistant:

void usage()
{
    std::cerr << "Usage: ptxinfo [options] file\n"
              << "  -v Show ptex software version\n"
              << "  -m Dump meta data\n"
              << "  -f Dump face info\n"
              << "  -d Dump data\n"
              << "  -D Dump data for all mipmap levels\n"
              << "  -t Dump tiling info\n"
              << "  -i Dump internal info\n"
              << "  -c Check validity of adjacency data\n";
    exit(1);
}